

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

type cm::operator==(String *l,
                   StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *r)

{
  type tVar1;
  string_view local_48;
  string local_38;
  
  local_48 = AsStringView<cm::String>::view(l);
  StringOpPlus::operator_cast_to_string(&local_38,(StringOpPlus *)r);
  tVar1 = operator==(&local_48,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return tVar1;
}

Assistant:

typename std::enable_if<AsStringView<L>::value, bool>::type operator==(
  L&& l, StringOpPlus<RL, RR> const& r)
{
  return AsStringView<L>::view(std::forward<L>(l)) == std::string(r);
}